

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void __thiscall DataSet::normalize(DataSet *this,double beg,double end)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  double local_30;
  double local_28;
  
  if ((this->m_inputSet).m_shape.field_0.m_dims[1] != 0) {
    uVar5 = 0;
    do {
      if ((this->m_inputSet).m_shape.field_0.m_dims[0] == 0) {
        local_28 = 0.0;
        local_30 = 0.0;
      }
      else {
        local_30 = 0.0;
        uVar4 = 0;
        local_28 = 0.0;
        do {
          pvVar2 = Matrix::operator[](&this->m_inputSet,uVar4);
          if (local_30 <
              (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar5]) {
            pvVar2 = Matrix::operator[](&this->m_inputSet,uVar4);
            local_30 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar5];
          }
          pvVar2 = Matrix::operator[](&this->m_inputSet,uVar4);
          pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar5;
          if (*pdVar3 <= local_28 && local_28 != *pdVar3) {
            pvVar2 = Matrix::operator[](&this->m_inputSet,uVar4);
            local_28 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar5];
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (this->m_inputSet).m_shape.field_0.m_dims[0]);
      }
      if ((this->m_inputSet).m_shape.field_0.m_dims[0] != 0) {
        uVar4 = 0;
        do {
          pvVar2 = Matrix::operator[](&this->m_inputSet,uVar4);
          dVar1 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
          pdVar3 = Matrix::set(&this->m_inputSet,uVar4,(uint)uVar5);
          *pdVar3 = (dVar1 - local_28) / (local_30 - local_28);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (this->m_inputSet).m_shape.field_0.m_dims[0]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->m_inputSet).m_shape.field_0.m_dims[1]);
  }
  return;
}

Assistant:

void DataSet::normalize(double beg, double end){
    for(uint i=0;i<m_inputSet.m_shape.n_col;++i){
        double min=0, max=0;
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            if(max<m_inputSet[j][i]) max=m_inputSet[j][i];
            if(min>m_inputSet[j][i]) min=m_inputSet[j][i];
        }
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            m_inputSet.set(j, i)=(m_inputSet[j][i]-min)/(max-min);
        }
    }
}